

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall
chrono::fea::Brick_Mass::Evaluate
          (Brick_Mass *this,ChMatrixNM<double,_24,_24> *result,double x,double y,double z)

{
  ShapeVector *N;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ChElementHexaANCF_3813 *pCVar8;
  ChMatrixNM<double,_8,_3> *pCVar9;
  double dVar10;
  double dVar11;
  ChMatrixNM<double,_3,_24> *pCVar12;
  int i;
  long lVar13;
  double *pdVar14;
  Index row;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  double dVar36;
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  type tmp;
  Scalar local_12b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>
  local_12b0;
  ChMatrixNM<double,_3,_24> *local_1288;
  Matrix<double,_24,_24,_0,_24,_24> local_1280;
  
  N = &this->N;
  dVar36 = x;
  ChElementHexaANCF_3813::ShapeFunctions((ChElementHexaANCF_3813 *)this,N,x,y,z);
  dVar38 = y;
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeX(this->element,&this->Nx,dVar36,y,z);
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeY(this->element,&this->Ny,x,dVar38,z);
  pCVar8 = this->element;
  dVar10 = (2.0 / (pCVar8->m_InertFlexVec).m_data[2]) * 0.125;
  dVar11 = (1.0 - x) * dVar10;
  dVar36 = (1.0 - y) * dVar11;
  dVar10 = (x + 1.0) * dVar10;
  dVar38 = (y + 1.0) * dVar10;
  dVar11 = (y + 1.0) * dVar11;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar11;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar38;
  auVar34 = vunpcklpd_avx(auVar31,auVar34);
  dVar10 = (1.0 - y) * dVar10;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar10;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar36;
  auVar33 = vunpcklpd_avx(auVar32,auVar33);
  auVar40._16_16_ = auVar34;
  auVar40._0_16_ = auVar33;
  auVar35._8_8_ = 0x8000000000000000;
  auVar35._0_8_ = 0x8000000000000000;
  auVar35._16_8_ = 0x8000000000000000;
  auVar35._24_8_ = 0x8000000000000000;
  auVar35 = vxorpd_avx512vl(auVar40,auVar35);
  *(undefined1 (*) [32])
   (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array =
       auVar35;
  (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[4]
       = dVar36;
  (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[5]
       = dVar10;
  (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[6]
       = dVar38;
  (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[7]
       = dVar11;
  pCVar12 = &this->S;
  lVar13 = 0;
  do {
    (pCVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>).m_storage.m_data.array
    [0] = (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [lVar13];
    dVar36 = (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.
             array[lVar13];
    (pCVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>).m_storage.m_data.array
    [0x19] = dVar36;
    (pCVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>).m_storage.m_data.array
    [0x32] = dVar36;
    lVar13 = lVar13 + 1;
    pCVar12 = (ChMatrixNM<double,_3,_24> *)
              ((pCVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>).m_storage.
               m_data.array + 3);
  } while (lVar13 != 8);
  pCVar9 = this->d0;
  auVar34 = *(undefined1 (*) [16])
             ((pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0x15);
  dVar36 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[7];
  auVar19._8_8_ = dVar36;
  auVar19._0_8_ = dVar36;
  auVar33 = *(undefined1 (*) [16])
             ((pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0x12);
  dVar36 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[6];
  auVar26._8_8_ = dVar36;
  auVar26._0_8_ = dVar36;
  auVar32 = *(undefined1 (*) [16])
             ((pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0xf);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar15 = vmovddup_avx512vl(auVar30);
  auVar31 = *(undefined1 (*) [16])
             ((pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0xc);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar16 = vmovddup_avx512vl(auVar29);
  auVar30 = *(undefined1 (*) [16])
             ((pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 9);
  dVar36 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[3];
  auVar49._8_8_ = dVar36;
  auVar49._0_8_ = dVar36;
  auVar29 = *(undefined1 (*) [16])
             ((pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 6);
  dVar38 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[2];
  auVar47._8_8_ = dVar38;
  auVar47._0_8_ = dVar38;
  auVar28 = *(undefined1 (*) [16])
             ((pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 3);
  dVar38 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[1];
  auVar44._8_8_ = dVar38;
  auVar44._0_8_ = dVar38;
  auVar27 = *(undefined1 (*) [16])
             (pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data
             .array;
  dVar11 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[0];
  auVar42._8_8_ = dVar11;
  auVar42._0_8_ = dVar11;
  auVar37._0_8_ = auVar27._0_8_ * dVar11;
  auVar37._8_8_ = auVar27._8_8_ * dVar11;
  auVar17 = vfmadd231pd_fma(auVar37,auVar28,auVar44);
  auVar17 = vfmadd231pd_fma(auVar17,auVar29,auVar47);
  auVar17 = vfmadd231pd_fma(auVar17,auVar30,auVar49);
  auVar17 = vfmadd231pd_avx512vl(auVar17,auVar31,auVar16);
  auVar17 = vfmadd231pd_avx512vl(auVar17,auVar32,auVar15);
  auVar17 = vfmadd231pd_fma(auVar17,auVar33,auVar26);
  auVar44 = vfmadd231pd_fma(auVar17,auVar34,auVar19);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [2];
  auVar17 = vmulsd_avx512f(auVar42,auVar41);
  dVar11 = (pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
           array[5];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar11;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar38 * dVar11;
  auVar17 = vaddsd_avx512f(auVar17,auVar45);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [8];
  auVar18 = vmulsd_avx512f(auVar47,auVar46);
  dVar38 = (pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
           array[0xb];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar38;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar36 * dVar38;
  auVar18 = vaddsd_avx512f(auVar18,auVar50);
  auVar17 = vaddsd_avx512f(auVar17,auVar18);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [0xe];
  auVar16 = vmulsd_avx512f(auVar16,auVar51);
  dVar36 = (pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
           array[0x11];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar36;
  auVar15 = vmulsd_avx512f(auVar15,auVar52);
  auVar15 = vaddsd_avx512f(auVar16,auVar15);
  dVar38 = (pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
           array[0x14];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar38;
  auVar16 = vmulsd_avx512f(auVar26,auVar53);
  dVar11 = (pCVar9->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
           array[0x17];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar11;
  auVar18 = vmulsd_avx512f(auVar19,auVar55);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar16._0_8_ + auVar18._0_8_;
  auVar15 = vaddsd_avx512f(auVar15,auVar25);
  auVar19 = vaddsd_avx512f(auVar17,auVar15);
  auVar37 = vshufpd_avx(auVar44,auVar44,1);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar17 = vmovddup_avx512vl(auVar17);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar15 = vmovddup_avx512vl(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar16 = vmovddup_avx512vl(auVar16);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar18 = vmovddup_avx512vl(auVar18);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar20 = vmovddup_avx512vl(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar21 = vmovddup_avx512vl(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar22 = vmovddup_avx512vl(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar23 = vmovddup_avx512vl(auVar23);
  auVar24 = vmulpd_avx512vl(auVar27,auVar23);
  auVar24 = vfmadd231pd_avx512vl(auVar24,auVar28,auVar22);
  auVar24 = vfmadd231pd_avx512vl(auVar24,auVar29,auVar21);
  auVar24 = vfmadd231pd_avx512vl(auVar24,auVar30,auVar20);
  auVar24 = vfmadd231pd_avx512vl(auVar24,auVar31,auVar18);
  auVar24 = vfmadd231pd_avx512vl(auVar24,auVar32,auVar16);
  auVar24 = vfmadd231pd_avx512vl(auVar24,auVar33,auVar15);
  auVar25 = vfmadd231pd_avx512vl(auVar24,auVar34,auVar17);
  auVar26 = vshufpd_avx512vl(auVar25,auVar25,1);
  auVar23 = vmulsd_avx512f(auVar41,auVar23);
  auVar22 = vmulsd_avx512f(auVar43,auVar22);
  auVar22 = vaddsd_avx512f(auVar22,auVar23);
  auVar21 = vmulsd_avx512f(auVar46,auVar21);
  auVar20 = vmulsd_avx512f(auVar48,auVar20);
  auVar20 = vaddsd_avx512f(auVar20,auVar21);
  auVar20 = vaddsd_avx512f(auVar20,auVar22);
  auVar18 = vmulsd_avx512f(auVar51,auVar18);
  auVar16 = vmulsd_avx512f(auVar52,auVar16);
  auVar16 = vaddsd_avx512f(auVar16,auVar18);
  auVar15 = vmulsd_avx512f(auVar53,auVar15);
  auVar17 = vmulsd_avx512f(auVar55,auVar17);
  auVar17 = vaddsd_avx512f(auVar17,auVar15);
  auVar17 = vaddsd_avx512f(auVar17,auVar16);
  auVar17 = vaddsd_avx512f(auVar17,auVar20);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar15 = vmovddup_avx512vl(auVar24);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[6];
  auVar16 = vmovddup_avx512vl(auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[5];
  auVar18 = vmovddup_avx512vl(auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[4];
  auVar20 = vmovddup_avx512vl(auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[3];
  auVar21 = vmovddup_avx512vl(auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[2];
  auVar22 = vmovddup_avx512vl(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[1];
  auVar23 = vmovddup_avx512vl(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[0];
  auVar24 = vmovddup_avx512vl(auVar7);
  auVar27 = vmulpd_avx512vl(auVar27,auVar24);
  auVar28 = vfmadd231pd_avx512vl(auVar27,auVar23,auVar28);
  auVar29 = vfmadd231pd_avx512vl(auVar28,auVar22,auVar29);
  auVar30 = vfmadd231pd_avx512vl(auVar29,auVar21,auVar30);
  auVar31 = vfmadd231pd_avx512vl(auVar30,auVar20,auVar31);
  auVar32 = vfmadd231pd_avx512vl(auVar31,auVar18,auVar32);
  auVar33 = vfmadd231pd_avx512vl(auVar32,auVar16,auVar33);
  auVar33 = vfmadd231pd_avx512vl(auVar33,auVar15,auVar34);
  auVar32 = vmulsd_avx512f(auVar41,auVar24);
  auVar31 = vmulsd_avx512f(auVar43,auVar23);
  auVar30 = vmulsd_avx512f(auVar46,auVar22);
  auVar29 = vmulsd_avx512f(auVar48,auVar21);
  auVar28 = vmulsd_avx512f(auVar51,auVar20);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar36;
  auVar27 = vmulsd_avx512f(auVar27,auVar18);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar38;
  auVar16 = vmulsd_avx512f(auVar54,auVar16);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar11;
  auVar15 = vmulsd_avx512f(auVar56,auVar15);
  auVar34 = vshufpd_avx(auVar33,auVar33,1);
  auVar18 = vmulsd_avx512f(auVar17,auVar34);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       auVar15._0_8_ + auVar16._0_8_ + auVar27._0_8_ + auVar28._0_8_ +
       auVar29._0_8_ + auVar30._0_8_ + auVar31._0_8_ + auVar32._0_8_;
  auVar32 = vfmsub231sd_avx512f(auVar18,auVar26,auVar39);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar19._0_8_ * auVar34._0_8_;
  auVar34 = vfmsub231sd_fma(auVar28,auVar37,auVar39);
  auVar34 = vmulsd_avx512f(auVar25,auVar34);
  auVar31 = vmulsd_avx512f(auVar19,auVar26);
  auVar31 = vfmsub231sd_avx512f(auVar31,auVar37,auVar17);
  local_12b0.m_lhs.m_functor.m_other =
       (pCVar8->m_InertFlexVec).m_data[2] * 0.5 *
       (pCVar8->m_InertFlexVec).m_data[1] * 0.5 *
       (pCVar8->m_InertFlexVec).m_data[0] * 0.5 *
       (auVar33._0_8_ * auVar31._0_8_ + (auVar44._0_8_ * auVar32._0_8_ - auVar34._0_8_));
  pCVar12 = &this->S;
  lVar13 = 0;
  local_12b0.m_rhs.m_matrix = pCVar12;
  local_1288 = pCVar12;
  memset(&local_1280,0,0x1200);
  local_12b8 = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,0,24,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,24,1,3,24>>const>,Eigen::Matrix<double,3,24,1,3,24>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,24,24,0,24,24>>(&local_1280,&local_12b0,pCVar12,&local_12b8);
  pdVar14 = (result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.
            m_data.array + 0x17;
  do {
    ((plain_array<double,_576,_1,_64> *)(pdVar14 + -0x17))->array[0] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13];
    pdVar14[-0x16] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13 + 0x18];
    pdVar14[-0x15] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13 + 0x30];
    pdVar14[-0x14] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13 + 0x48];
    pdVar14[-0x13] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13 + 0x60];
    pdVar14[-0x12] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13 + 0x78];
    pdVar14[-0x11] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13 + 0x90];
    pdVar14[-0x10] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13 + 0xa8];
    pdVar14[-0xf] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13 + 0xc0];
    pdVar14[-0xe] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13 + 0xd8];
    pdVar14[-0xd] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13 + 0xf0];
    pdVar14[-0xc] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13 + 0x108];
    pdVar14[-0xb] =
         local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage.
         m_data.array[lVar13 + 0x120];
    pdVar14[-10] = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.
                   m_storage.m_data.array[lVar13 + 0x138];
    pdVar14[-9] = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.
                  m_storage.m_data.array[lVar13 + 0x150];
    pdVar14[-8] = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.
                  m_storage.m_data.array[lVar13 + 0x168];
    pdVar14[-7] = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.
                  m_storage.m_data.array[lVar13 + 0x180];
    pdVar14[-6] = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.
                  m_storage.m_data.array[lVar13 + 0x198];
    pdVar14[-5] = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.
                  m_storage.m_data.array[lVar13 + 0x1b0];
    pdVar14[-4] = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.
                  m_storage.m_data.array[lVar13 + 0x1c8];
    pdVar14[-3] = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.
                  m_storage.m_data.array[lVar13 + 0x1e0];
    pdVar14[-2] = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.
                  m_storage.m_data.array[lVar13 + 0x1f8];
    pdVar14[-1] = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.
                  m_storage.m_data.array[lVar13 + 0x210];
    *pdVar14 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
               .m_data.array[lVar13 + 0x228];
    lVar13 = lVar13 + 1;
    pdVar14 = pdVar14 + 0x18;
  } while (lVar13 != 0x18);
  return;
}

Assistant:

void Brick_Mass::Evaluate(ChMatrixNM<double, 24, 24>& result, const double x, const double y, const double z) {
    element->ShapeFunctions(N, x, y, z);
    element->ShapeFunctionsDerivativeX(Nx, x, y, z);
    element->ShapeFunctionsDerivativeY(Ny, x, y, z);
    element->ShapeFunctionsDerivativeZ(Nz, x, y, z);

    // S=[N1*eye(3) N2*eye(3) N3*eye(3) N4*eye(3)...]
    for (int i = 0; i < 8; i++) {
        S(0, 3 * i + 0) = N(i);
        S(1, 3 * i + 1) = N(i);
        S(2, 3 * i + 2) = N(i);
    }

    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = (*d0).transpose() * Nx.transpose();
    rd0.col(1) = (*d0).transpose() * Ny.transpose();
    rd0.col(2) = (*d0).transpose() * Nz.transpose();
    double detJ0 = rd0.determinant();

    // Perform  r = S'*S
    double factor = detJ0 * (element->GetLengthX() / 2) * (element->GetLengthY() / 2) * (element->GetLengthZ() / 2);
    result = factor * S.transpose() * S;
}